

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_common.c
# Opt level: O0

char * CP_GetContactString(SstStream Stream,attr_list DPAttrs)

{
  atom_t aVar1;
  undefined4 uVar2;
  int iVar3;
  undefined8 uVar4;
  char *pcVar5;
  undefined8 uVar6;
  long in_RSI;
  undefined8 *in_RDI;
  char *ret;
  attr_list ContactList;
  attr_list ListenList;
  
  uVar4 = create_attr_list();
  aVar1 = CM_TRANSPORT_ATOM;
  pcVar5 = strdup(*(char **)(in_RDI[0x24] + 0x50));
  set_string_attr(uVar4,aVar1,pcVar5);
  aVar1 = IP_INTERFACE_ATOM;
  if (*(long *)(in_RDI[0x24] + 0x60) == 0) {
    if (*(long *)(in_RDI[0x24] + 0x58) != 0) {
      pcVar5 = strdup(*(char **)(in_RDI[0x24] + 0x58));
      set_string_attr(uVar4,aVar1,pcVar5);
    }
  }
  else {
    uVar2 = attr_atom_from_string("IP_INTERFACE");
    pcVar5 = strdup(*(char **)(in_RDI[0x24] + 0x60));
    set_string_attr(uVar4,uVar2,pcVar5);
  }
  uVar6 = CMget_specific_contact_list(**(undefined8 **)*in_RDI,uVar4);
  uVar6 = CMderef_and_copy_list(**(undefined8 **)*in_RDI,uVar6);
  iVar3 = strcmp(*(char **)(in_RDI[0x24] + 0x50),"enet");
  if (iVar3 == 0) {
    set_int_attr(uVar6,CM_ENET_CONN_TIMEOUT,60000);
  }
  aVar1 = SST_GROUP_ID_ATOM;
  if (*(long *)(in_RDI[0x24] + 0x98) != 0) {
    pcVar5 = strdup(*(char **)(in_RDI[0x24] + 0x98));
    set_string_attr(uVar6,aVar1,pcVar5);
  }
  if (in_RSI != 0) {
    attr_merge_lists(uVar6,in_RSI);
  }
  pcVar5 = (char *)attr_list_to_string(uVar6);
  free_attr_list(uVar4);
  free_attr_list(uVar6);
  return pcVar5;
}

Assistant:

extern char *CP_GetContactString(SstStream Stream, attr_list DPAttrs)
{
    attr_list ListenList = create_attr_list(), ContactList;
    set_string_attr(ListenList, CM_TRANSPORT_ATOM, strdup(Stream->ConfigParams->ControlTransport));
    if (Stream->ConfigParams->ControlInterface)
    {
        set_string_attr(ListenList, attr_atom_from_string("IP_INTERFACE"),
                        strdup(Stream->ConfigParams->ControlInterface));
    }
    else if (Stream->ConfigParams->NetworkInterface)
    {
        set_string_attr(ListenList, IP_INTERFACE_ATOM,
                        strdup(Stream->ConfigParams->NetworkInterface));
    }
    ContactList = CMget_specific_contact_list(Stream->CPInfo->SharedCM->cm, ListenList);
    ContactList = CMderef_and_copy_list(Stream->CPInfo->SharedCM->cm, ContactList);
    if (strcmp(Stream->ConfigParams->ControlTransport, "enet") == 0)
    {
        set_int_attr(ContactList, CM_ENET_CONN_TIMEOUT, 60000); /* 60 seconds */
    }
    if (Stream->ConfigParams->RemoteGroup)
    {
        set_string_attr(ContactList, SST_GROUP_ID_ATOM, strdup(Stream->ConfigParams->RemoteGroup));
    }
    if (DPAttrs)
    {
        attr_merge_lists(ContactList, DPAttrs);
    }
    char *ret = attr_list_to_string(ContactList);
    free_attr_list(ListenList);
    free_attr_list(ContactList);
    return ret;
}